

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::analyze_extractvalue_instruction(Impl *impl,ExtractValueInst *inst)

{
  ExtractValueInst *pEVar1;
  bool bVar2;
  uint uVar3;
  TypeID TVar4;
  Value *pVVar5;
  Type *this;
  uint *puVar6;
  Value *pVStack_28;
  uint index;
  mapped_type *local_20;
  mapped_type *meta;
  ExtractValueInst *inst_local;
  Impl *impl_local;
  
  meta = (mapped_type *)inst;
  inst_local = (ExtractValueInst *)impl;
  uVar3 = LLVMBC::ExtractValueInst::getNumIndices(inst);
  if (uVar3 == 1) {
    pVVar5 = LLVMBC::ExtractValueInst::getAggregateOperand((ExtractValueInst *)meta);
    this = LLVMBC::Value::getType(pVVar5);
    TVar4 = LLVMBC::Type::getTypeID(this);
    if (TVar4 == StructTyID) {
      pEVar1 = inst_local + 9;
      pVStack_28 = LLVMBC::ExtractValueInst::getAggregateOperand((ExtractValueInst *)meta);
      local_20 = std::
                 unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                 ::operator[]((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                               *)&(pEVar1->super_Instruction).operands.
                                  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              &stack0xffffffffffffffd8);
      puVar6 = LLVMBC::ExtractValueInst::getIndices((ExtractValueInst *)meta);
      uVar3 = *puVar6;
      local_20->access_mask = 1 << ((byte)uVar3 & 0x1f) | local_20->access_mask;
      if (local_20->components <= uVar3) {
        local_20->components = uVar3 + 1;
      }
      pVVar5 = LLVMBC::ExtractValueInst::getAggregateOperand((ExtractValueInst *)meta);
      bVar2 = instruction_is_ballot(pVVar5);
      if (bVar2) {
        if (uVar3 == 0) {
          *(undefined1 *)
           ((long)&inst_local[0x17].super_Instruction.attachments._M_h._M_before_begin._M_nxt + 3) =
               1;
        }
        else {
          *(undefined1 *)
           ((long)&inst_local[0x17].super_Instruction.attachments._M_h._M_before_begin._M_nxt + 2) =
               1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool analyze_extractvalue_instruction(Converter::Impl &impl, const llvm::ExtractValueInst *inst)
{
	if (inst->getNumIndices() == 1 &&
	    inst->getAggregateOperand()->getType()->getTypeID() == llvm::Type::TypeID::StructTyID)
	{
		auto &meta = impl.llvm_composite_meta[inst->getAggregateOperand()];
		unsigned index = inst->getIndices()[0];
		meta.access_mask |= 1u << index;
		if (index >= meta.components)
			meta.components = index + 1;

		if (instruction_is_ballot(inst->getAggregateOperand()))
		{
			if (index == 0)
				impl.shader_analysis.subgroup_ballot_reads_first = true;
			else
				impl.shader_analysis.subgroup_ballot_reads_upper = true;
		}
	}
	return true;
}